

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::Initialize
          (ChLinkUniversal *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2
          ,ChFrame<double> *frame)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  element_type *peVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ChBodyFrame *pCVar8;
  ChBodyFrame *pCVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  peVar5 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar9 = &peVar5->super_ChBodyFrame;
  if (peVar5 == (element_type *)0x0) {
    pCVar9 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar9;
  peVar5 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar8 = &peVar5->super_ChBodyFrame;
  if (peVar5 == (element_type *)0x0) {
    pCVar8 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar8;
  iVar6 = (*(pCVar9->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar7 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_x,(ChVariables *)CONCAT44(extraout_var,iVar6),
             (ChVariables *)CONCAT44(extraout_var_00,iVar7));
  iVar6 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar7 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_y,(ChVariables *)CONCAT44(extraout_var_01,iVar6),
             (ChVariables *)CONCAT44(extraout_var_02,iVar7));
  iVar6 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar7 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_z,(ChVariables *)CONCAT44(extraout_var_03,iVar6),
             (ChVariables *)CONCAT44(extraout_var_04,iVar7));
  iVar6 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar7 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_05,iVar6),
             (ChVariables *)CONCAT44(extraout_var_06,iVar7));
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLink).Body1,frame,&this->m_frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLink).Body2,frame,&this->m_frame2);
  dVar1 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  dVar3 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  dVar4 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar17._0_8_ = -dVar3;
  auVar17._8_8_ = 0x8000000000000000;
  auVar18 = vpslldq_avx(auVar17,8);
  auVar11 = vunpcklpd_avx(auVar21,auVar14);
  auVar20._0_8_ = -dVar1;
  auVar20._8_8_ = 0x8000000000000000;
  auVar21 = vpslldq_avx(auVar20,8);
  auVar12._0_8_ = -dVar2;
  auVar12._8_8_ = 0x8000000000000000;
  auVar10 = vunpcklpd_avx(auVar12,auVar13);
  *(undefined1 (*) [16])
   (this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar18;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
       auVar11;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       auVar21;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar10;
  (this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  dVar1 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar18._0_8_ = -dVar1;
  auVar18._8_8_ = 0x8000000000000000;
  auVar13 = vpslldq_avx(auVar18,8);
  dVar1 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar11 = vunpcklpd_avx(auVar15,auVar11);
  auVar19._0_8_ = -dVar4;
  auVar19._8_8_ = 0x8000000000000000;
  auVar21 = vpslldq_avx(auVar19,8);
  auVar10._0_8_ = -dVar1;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10 = vunpcklpd_avx(auVar10,auVar16);
  *(undefined1 (*) [16])
   (this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar13;
  *(undefined1 (*) [16])
   ((this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
       auVar11;
  *(undefined1 (*) [16])
   ((this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       auVar21;
  *(undefined1 (*) [16])
   ((this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar10;
  (this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  return;
}

Assistant:

void ChLinkUniversal::Initialize(std::shared_ptr<ChBody> body1,
                                 std::shared_ptr<ChBody> body2,
                                 const ChFrame<>& frame) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_x.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_y.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_z.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ((ChFrame<>*)Body1)->TransformParentToLocal(frame, m_frame1);
    ((ChFrame<>*)Body2)->TransformParentToLocal(frame, m_frame2);

    m_u1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Xaxis());
    m_v2_tilde = ChStarMatrix33<>(m_frame2.GetA().Get_A_Yaxis());

    m_C(0) = 0.0;
    m_C(1) = 0.0;
    m_C(2) = 0.0;
    m_C(3) = 0.0;
}